

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

_Bool rifiuti_init(rbin_type type,char *usage_param,char *usage_summary,char ***argv,GError **error)

{
  int iVar1;
  GPtrArray *pGVar2;
  GHashTable *pGVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  GOptionEntry *pGVar6;
  char **argv_u8;
  long local_38;
  
  setlocale(6,"");
  init_handles();
  meta = (metarecord *)g_malloc0(0x38);
  pGVar2 = (GPtrArray *)g_ptr_array_new();
  meta->records = pGVar2;
  g_ptr_array_set_free_func(pGVar2,_free_record_cb);
  pGVar3 = (GHashTable *)g_hash_table_new_full(g_str_hash,g_str_equal,g_free,g_error_free);
  meta->invalid_records = pGVar3;
  allidxfiles = (GPtrArray *)g_ptr_array_new_with_free_func(g_free);
  uVar4 = g_option_context_new(usage_param);
  g_option_context_set_summary(uVar4,usage_summary);
  meta->type = type;
  uVar5 = dcgettext(0,"Usage help: %s\nBug report: %s\nMore info : %s",5);
  uVar5 = g_strdup_printf(uVar5,"https://github.com/abelcheung/rifiuti2/wiki/Usage-and-Examples",
                          "https://github.com/abelcheung/rifiuti2/issues",
                          "https://abelcheung.github.io/rifiuti2/");
  g_option_context_set_description(uVar4,uVar5);
  g_free(uVar5);
  uVar5 = g_option_group_new(0,0,0,meta,0);
  g_option_group_add_entries(uVar5,main_options);
  if (type == RECYCLE_BIN_TYPE_FILE) {
    pGVar6 = rbinfile_options;
  }
  else {
    if (type != RECYCLE_BIN_TYPE_DIR) goto LAB_00104475;
    pGVar6 = live_options;
  }
  g_option_group_add_entries(uVar5,pGVar6);
LAB_00104475:
  g_option_group_set_parse_hooks(uVar5,0,_fileargs_handler);
  g_option_context_set_main_group(uVar4,uVar5);
  uVar5 = dcgettext(0,"Output format options:",5);
  uVar5 = g_option_group_new("format",uVar5,"Show output formatting options",0,0);
  g_option_group_add_entries(uVar5,out_options);
  g_option_group_set_parse_hooks(uVar5,0,_set_def_output_opts);
  g_option_context_add_group(uVar4,uVar5);
  g_option_context_set_help_enabled(uVar4,1);
  local_38 = g_strdupv(*argv);
  iVar1 = g_strv_length(local_38);
  if (iVar1 == 1) {
    local_38 = g_realloc_n(local_38,3,8);
    *(char **)(local_38 + 8) = "--help-all";
    *(undefined8 *)(local_38 + 0x10) = 0;
    iVar1 = 2;
  }
  uVar5 = g_strjoinv("|",local_38);
  g_log("rifiuti2",0x80,"Calling argv_u8 (%zu): %s",iVar1,uVar5);
  g_free(uVar5);
  g_option_context_parse_strv(uVar4,&local_38,error);
  g_option_context_free(uVar4);
  g_strfreev(local_38);
  return *error == (GError *)0x0;
}

Assistant:

bool
rifiuti_init (rbin_type  type,
              char      *usage_param,
              char      *usage_summary,
              char    ***argv,
              GError   **error)
{
    GOptionContext *context;

    setlocale (LC_ALL, "");
    init_handles ();

    /* Initialize metadata struct */
    meta = g_malloc0 (sizeof (metarecord));
    meta->records = g_ptr_array_new ();
    g_ptr_array_set_free_func (meta->records, (GDestroyNotify) _free_record_cb);
    meta->invalid_records = g_hash_table_new_full (
        g_str_hash,
        g_str_equal,
        (GDestroyNotify) g_free,
        (GDestroyNotify) g_error_free
    );

    // Other global structures
    allidxfiles = g_ptr_array_new_with_free_func ((GDestroyNotify) g_free);

    /* Parse command line arguments and generate help */
    context = g_option_context_new (usage_param);
    g_option_context_set_summary (context, usage_summary);
    _opt_ctxt_setup (&context, type);

    return _opt_ctxt_parse (&context, argv, error);
}